

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_splati_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x13bf,"void msa_splat_df(uint32_t, wr_t *, wr_t *, target_ulong)");
  }
  lVar1 = (ulong)wd * 0x10 + 0x338;
  lVar2 = (ulong)ws * 0x10 + 0x338;
  uVar4 = (ulong)((int)(0x80L >> ((char)df + 3U & 0x3f)) - 1U & n);
  switch(df) {
  case 0:
    lVar3 = 0;
    do {
      *(undefined1 *)((long)(env->active_fpu).fpr + lVar3 + lVar1 + -0x338) =
           *(undefined1 *)((long)(env->active_fpu).fpr + uVar4 + lVar2 + -0x338);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    break;
  case 1:
    lVar3 = 0;
    do {
      *(undefined2 *)((long)(env->active_fpu).fpr + lVar3 * 2 + lVar1 + -0x338) =
           *(undefined2 *)((long)(env->active_fpu).fpr + uVar4 * 2 + lVar2 + -0x338);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    break;
  case 2:
    lVar3 = 0;
    do {
      *(undefined4 *)((long)(env->active_fpu).fpr + lVar3 * 4 + lVar1 + -0x338) =
           *(undefined4 *)((long)(env->active_fpu).fpr + uVar4 * 4 + lVar2 + -0x338);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 3:
    lVar3 = 0;
    do {
      *(undefined8 *)((long)(env->active_fpu).fpr + lVar3 * 8 + lVar1 + -0x338) =
           *(undefined8 *)((long)(env->active_fpu).fpr + uVar4 * 8 + lVar2 + -0x338);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
  }
  return;
}

Assistant:

void helper_msa_splati_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws, uint32_t n)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    msa_splat_df(df, pwd, pws, n);
}